

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

void __thiscall wasm::DataFlow::Graph::build(Graph *this,Function *funcInit,Module *moduleInit)

{
  bool bVar1;
  size_t sVar2;
  Type TVar3;
  reference ppNVar4;
  Type type;
  Node *node;
  uint local_2c;
  Index i;
  size_t numLocals;
  Module *moduleInit_local;
  Function *funcInit_local;
  Graph *this_local;
  
  this->func = funcInit;
  this->module = moduleInit;
  sVar2 = Function::getNumLocals(this->func);
  if (sVar2 != 0) {
    setInReachable(this);
    for (local_2c = 0; local_2c < sVar2; local_2c = local_2c + 1) {
      TVar3 = Function::getLocalType(this->func,local_2c);
      bVar1 = isRelevantType(this,TVar3);
      if (bVar1) {
        TVar3 = Function::getLocalType(this->func,local_2c);
        bVar1 = Function::isParam(this->func,local_2c);
        if (bVar1) {
          type.id = (uintptr_t)makeVar(this,TVar3);
        }
        else {
          type.id = (uintptr_t)makeZero(this,TVar3);
        }
        ppNVar4 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::
                  operator[](&this->locals,(ulong)local_2c);
        *ppNVar4 = (value_type)type.id;
      }
    }
    Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
              ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,this->func->body);
  }
  return;
}

Assistant:

void build(Function* funcInit, Module* moduleInit) {
    func = funcInit;
    module = moduleInit;

    auto numLocals = func->getNumLocals();
    if (numLocals == 0) {
      return; // nothing to do
    }
    // Set up initial local state IR.
    setInReachable();
    for (Index i = 0; i < numLocals; i++) {
      if (!isRelevantType(func->getLocalType(i))) {
        continue;
      }
      Node* node;
      auto type = func->getLocalType(i);
      if (func->isParam(i)) {
        node = makeVar(type);
      } else {
        node = makeZero(type);
      }
      locals[i] = node;
    }
    // Process the function body, generating the rest of the IR.
    visit(func->body);
  }